

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

Matrix * __thiscall sptk::Matrix::operator-=(Matrix *this,Matrix *matrix)

{
  logic_error *this_00;
  iterator iVar1;
  iterator iVar2;
  const_iterator cVar3;
  iterator iVar4;
  long in_RSI;
  Matrix *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  
  if ((in_RDI->num_row_ == *(int *)(in_RSI + 8)) && (in_RDI->num_column_ == *(int *)(in_RSI + 0xc)))
  {
    iVar1 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
    iVar2 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff98);
    cVar3 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
    iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::minus<double>>
              (iVar1._M_current,iVar2._M_current,cVar3._M_current,iVar4._M_current);
    return in_RDI;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(anonymous_namespace)::kErrorMessageForLogicError);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Matrix& Matrix::operator-=(const Matrix& matrix) {
  if (num_row_ != matrix.num_row_ || num_column_ != matrix.num_column_) {
    throw std::logic_error(kErrorMessageForLogicError);
  }
  std::transform(data_.begin(), data_.end(), matrix.data_.begin(),
                 data_.begin(), std::minus<double>());
  return *this;
}